

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

QSize __thiscall QSplitter::minimumSizeHint(QSplitter *this)

{
  bool bVar1;
  Orientation OVar2;
  QSplitterPrivate *pQVar3;
  QSplitterPrivate *this_00;
  qsizetype qVar4;
  const_reference ppQVar5;
  int *piVar6;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QSplitterLayoutStruct *s;
  int i;
  int l;
  QSplitterPrivate *d;
  QSize splitterSize;
  QSize widgetSize;
  int t;
  QWidget *in_stack_ffffffffffffff98;
  int w;
  QSplitterLayoutStruct *this_01;
  int local_48;
  int local_2c;
  undefined1 *local_28;
  int local_20;
  QSize local_1c;
  int local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QSplitter *)0x69d5ba);
  QWidget::ensurePolished(in_RDI);
  local_14 = 0;
  local_48 = 0;
  while( true ) {
    this_00 = (QSplitterPrivate *)(long)local_48;
    qVar4 = QList<QSplitterLayoutStruct_*>::size(&pQVar3->list);
    if (qVar4 <= (long)this_00) break;
    ppQVar5 = QList<QSplitterLayoutStruct_*>::at
                        ((QList<QSplitterLayoutStruct_*> *)this_00,
                         (qsizetype)in_stack_ffffffffffffff98);
    this_01 = *ppQVar5;
    if (((this_01 != (QSplitterLayoutStruct *)0x0) && (this_01->widget != (QWidget *)0x0)) &&
       (bVar1 = QWidget::isHidden((QWidget *)0x69d652), !bVar1)) {
      local_1c = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_1c = qSmartMinSize(in_stack_ffffffffffffff98);
      bVar1 = QSize::isValid((QSize *)this_01);
      if (bVar1) {
        QSplitterPrivate::pick(this_00,(QSize *)in_stack_ffffffffffffff98);
        local_20 = QSplitterPrivate::trans(this_00,(QSize *)in_stack_ffffffffffffff98);
        piVar6 = qMax<int>(&local_14,&local_20);
        local_14 = *piVar6;
      }
      if ((this_01->handle != (QSplitterHandle *)0x0) &&
         (bVar1 = QWidget::isHidden((QWidget *)0x69d6e5), !bVar1)) {
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        local_28 = (undefined1 *)(**(code **)(*(long *)&this_01->handle->super_QWidget + 0x70))();
        bVar1 = QSize::isValid((QSize *)this_01);
        if (bVar1) {
          QSplitterPrivate::pick(this_00,(QSize *)in_stack_ffffffffffffff98);
          local_2c = QSplitterPrivate::trans(this_00,(QSize *)in_stack_ffffffffffffff98);
          piVar6 = qMax<int>(&local_14,&local_2c);
          local_14 = *piVar6;
        }
      }
    }
    local_48 = local_48 + 1;
  }
  OVar2 = orientation((QSplitter *)this_00);
  w = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (OVar2 == Horizontal) {
    QSize::QSize((QSize *)this_00,w,(int)in_stack_ffffffffffffff98);
  }
  else {
    QSize::QSize((QSize *)this_00,w,(int)in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QSplitter::minimumSizeHint() const
{
    Q_D(const QSplitter);
    ensurePolished();
    int l = 0;
    int t = 0;

    for (int i = 0; i < d->list.size(); ++i) {
        QSplitterLayoutStruct *s = d->list.at(i);
        if (!s || !s->widget)
            continue;
        if (s->widget->isHidden())
            continue;
        QSize widgetSize = qSmartMinSize(s->widget);
        if (widgetSize.isValid()) {
            l += d->pick(widgetSize);
            t = qMax(t, d->trans(widgetSize));
        }
        if (!s->handle || s->handle->isHidden())
            continue;
        QSize splitterSize = s->handle->sizeHint();
        if (splitterSize.isValid()) {
            l += d->pick(splitterSize);
            t = qMax(t, d->trans(splitterSize));
        }
    }
    return orientation() == Qt::Horizontal ? QSize(l, t) : QSize(t, l);
}